

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

void Cmd_utid(FCommandLine *argv,APlayerPawn *who,int key)

{
  int iVar1;
  int start_tid;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  
  iVar1 = FCommandLine::argc(argv);
  start_tid = 0;
  if (1 < iVar1) {
    pcVar4 = FCommandLine::operator[](argv,1);
    start_tid = atoi(pcVar4);
  }
  iVar2 = FCommandLine::argc(argv);
  iVar1 = 0;
  if (2 < iVar2) {
    pcVar4 = FCommandLine::operator[](argv,2);
    iVar2 = atoi(pcVar4);
    iVar1 = 0;
    if (-1 < iVar2) {
      pcVar4 = FCommandLine::operator[](argv,2);
      iVar1 = atoi(pcVar4);
    }
  }
  uVar3 = P_FindUniqueTID(start_tid,iVar1);
  Printf("%d\n",(ulong)uVar3);
  return;
}

Assistant:

CCMD(utid)
{
	Printf("%d\n",
		P_FindUniqueTID(argv.argc() > 1 ? atoi(argv[1]) : 0,
		(argv.argc() > 2 && atoi(argv[2]) >= 0) ? atoi(argv[2]) : 0));
}